

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Buffer::RemoveReadChain(Buffer *this,uint32_t l)

{
  BufferChain *pBVar1;
  uint uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  BufferChain *this_00;
  
  if (this->len <= l) {
    Clear(this);
    return;
  }
  this_00 = this->m_head;
  uVar4 = l;
  while( true ) {
    if ((this_00 == (BufferChain *)0x0) || (uVar4 == 0)) goto LAB_00105846;
    uVar3 = BufferChain::GetCanReadCount(this_00);
    uVar2 = uVar4;
    if ((uVar3 != 0) && (uVar2 = uVar4 - uVar3, uVar4 < uVar3)) break;
    uVar4 = uVar2;
    pBVar1 = this_00->nextpkt;
    (*this->_vptr_Buffer[1])(this,this_00);
    this->m_head = pBVar1;
    this_00 = pBVar1;
  }
  this_00->read = this_00->read + (short)uVar4;
  this_00 = this->m_head;
LAB_00105846:
  if (this_00 == (BufferChain *)0x0) {
    this->m_end = (BufferChain *)0x0;
  }
  this->len = this->len - l;
  return;
}

Assistant:

void Buffer::RemoveReadChain(uint32_t l)
{
    if(l >= len)
    {
        Clear();
        return;
    }
    uint32_t rlen = l;
    for(BufferChain* buff = this->m_head; buff != nullptr && rlen > 0;)
    {
        uint16_t canReadCount = buff->GetCanReadCount();
        if(canReadCount == 0)
        {
            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;

            continue;
        }
        if(rlen < canReadCount)
        {
            buff->read += rlen;
            break;
        }
        else
        {
            rlen -= canReadCount;
            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;
        }
    }
    if(m_head == nullptr)
        m_end = nullptr;

    len -= l;
}